

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O3

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  undefined1 *puVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long *plVar8;
  size_type *psVar9;
  byte *pbVar10;
  size_type sVar11;
  byte *pbVar12;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  iVar5 = ::std::__cxx11::string::compare((char *)arg);
  if ((((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)arg), iVar5 == 0)) ||
      (iVar5 = ::std::__cxx11::string::compare((char *)arg), iVar5 == 0)) ||
     (iVar5 = ::std::__cxx11::string::compare((char *)arg), iVar5 == 0)) {
LAB_00108917:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pbVar10 = (byte *)(arg->_M_dataplus)._M_p;
    pbVar12 = pbVar10 + arg->_M_string_length;
    goto LAB_0010892b;
  }
  iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2);
  if ((iVar5 != 0) &&
     (iVar5 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar5 != 0)) {
    local_70._M_dataplus._M_p = (pointer)0x0;
    bVar4 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_70);
    if ((bVar4) &&
       (lVar6 = ::std::__cxx11::string::find_first_not_of((char *)arg,0x13149e,0), lVar6 == -1))
    goto LAB_00108917;
  }
  pbVar10 = (byte *)(arg->_M_dataplus)._M_p;
  sVar11 = arg->_M_string_length;
  if (sVar11 == 1) {
    iVar5 = isprint((uint)*pbVar10);
    if (iVar5 == 0) goto LAB_00108a31;
    iVar5 = ::std::__cxx11::string::compare((char *)arg);
    if (iVar5 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_90);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70.field_2._8_8_ = plVar8[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar9;
        local_70._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00108be8;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,literalQuote);
    goto LAB_00108b7c;
  }
  if (*pbVar10 == 0x30) {
    bVar1 = pbVar10[1];
    if (bVar1 == 0x62) {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>>
                        (pbVar10 + 2,pbVar10 + sVar11);
    }
    else if (bVar1 == 0x6f) {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>>
                        (pbVar10 + 2,pbVar10 + sVar11);
    }
    else {
      if (bVar1 != 0x78) goto LAB_00108a1e;
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>>
                        (pbVar10 + 2,pbVar10 + sVar11);
    }
    pbVar12 = pbVar10 + sVar11;
    pbVar10 = (byte *)(arg->_M_dataplus)._M_p;
    sVar11 = arg->_M_string_length;
    if ((byte *)_Var7._M_current == pbVar12) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pbVar12 = pbVar10 + sVar11;
LAB_0010892b:
      ::std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pbVar10,pbVar12);
      return __return_storage_ptr__;
    }
  }
LAB_00108a1e:
  _Var7 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::is_printable(std::__cxx11::string_const&)::_lambda(char)_1_>>
                    (pbVar10,pbVar10 + sVar11);
  if ((byte *)_Var7._M_current != pbVar10 + sVar11) {
LAB_00108a31:
    binary_escape_string(__return_storage_ptr__,arg);
    return __return_storage_ptr__;
  }
  lVar6 = ::std::__cxx11::string::find_first_of((char *)arg,escapedChars_abi_cxx11_,0);
  if (lVar6 == -1) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
LAB_00108b7c:
    psVar3 = &local_70;
  }
  else {
    if (100 < arg->_M_string_length && !disable_multi_line) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'\'\'","");
      ::std::operator+(&local_70,&local_90,arg);
      ::std::operator+(__return_storage_ptr__,&local_70,"\'\'\'");
      goto LAB_00108b7c;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    add_escaped_characters(&local_50,arg);
    ::std::operator+(&local_70,&local_90,&local_50);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    psVar3 = &local_50;
  }
  puVar2 = (undefined1 *)(&(psVar3->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &psVar3->field_2) {
    operator_delete(puVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return __return_storage_ptr__;
  }
LAB_00108be8:
  operator_delete(local_90._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}